

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall bssl::anon_unknown_0::QUICMethodTest::QUICMethodTest(QUICMethodTest *this)

{
  initializer_list<unsigned_char> __l;
  initializer_list<unsigned_char> __l_00;
  allocator<unsigned_char> local_4a;
  uchar local_49;
  iterator local_48;
  size_type local_40;
  allocator<unsigned_char> local_22;
  uchar local_21;
  iterator local_20;
  size_type local_18;
  QUICMethodTest *local_10;
  QUICMethodTest *this_local;
  
  local_10 = this;
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__QUICMethodTest_00647590;
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&this->client_ctx_);
  std::unique_ptr<ssl_ctx_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_ctx_st,bssl::internal::Deleter> *)&this->server_ctx_);
  std::
  unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>>
  ::unique_ptr<std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>,void>
            ((unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>>
              *)&this->transport_);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&this->client_);
  std::unique_ptr<ssl_st,bssl::internal::Deleter>::unique_ptr<bssl::internal::Deleter,void>
            ((unique_ptr<ssl_st,bssl::internal::Deleter> *)&this->server_);
  local_21 = '\x01';
  local_20 = &local_21;
  local_18 = 1;
  std::allocator<unsigned_char>::allocator(&local_22);
  __l_00._M_len = local_18;
  __l_00._M_array = local_20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->server_transport_params_,__l_00,&local_22);
  std::allocator<unsigned_char>::~allocator(&local_22);
  local_49 = '\x02';
  local_48 = &local_49;
  local_40 = 1;
  std::allocator<unsigned_char>::allocator(&local_4a);
  __l._M_len = local_40;
  __l._M_array = local_48;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&this->server_quic_early_data_context_,__l,&local_4a);
  std::allocator<unsigned_char>::~allocator(&local_4a);
  this->allow_out_of_order_writes_ = false;
  return;
}

Assistant:

void SetUp() override {
    client_ctx_.reset(SSL_CTX_new(TLS_method()));
    server_ctx_ = CreateContextWithTestCertificate(TLS_method());
    ASSERT_TRUE(client_ctx_);
    ASSERT_TRUE(server_ctx_);

    SSL_CTX_set_min_proto_version(server_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_max_proto_version(server_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_min_proto_version(client_ctx_.get(), TLS1_3_VERSION);
    SSL_CTX_set_max_proto_version(client_ctx_.get(), TLS1_3_VERSION);

    static const uint8_t kALPNProtos[] = {0x03, 'f', 'o', 'o'};
    ASSERT_EQ(SSL_CTX_set_alpn_protos(client_ctx_.get(), kALPNProtos,
                                      sizeof(kALPNProtos)),
              0);
    SSL_CTX_set_alpn_select_cb(
        server_ctx_.get(),
        [](SSL *ssl, const uint8_t **out, uint8_t *out_len, const uint8_t *in,
           unsigned in_len, void *arg) -> int {
          return SSL_select_next_proto(
                     const_cast<uint8_t **>(out), out_len, in, in_len,
                     kALPNProtos, sizeof(kALPNProtos)) == OPENSSL_NPN_NEGOTIATED
                     ? SSL_TLSEXT_ERR_OK
                     : SSL_TLSEXT_ERR_NOACK;
        },
        nullptr);
  }